

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O0

void stressing_multi_threads(int threadNum)

{
  ostream *this;
  Thread *this_00;
  __shared_ptr_access<Thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *this_02;
  int local_98;
  allocator local_91;
  int i_1;
  ThreadFunc local_70;
  undefined1 local_40 [8];
  shared_ptr<Thread> tmp;
  undefined1 local_28 [4];
  int i;
  vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> vsp;
  int threadNum_local;
  
  vsp.super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._4_4_ = threadNum;
  this = std::operator<<((ostream *)&std::cout,"----------stressing test multi thread-----------");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::vector
            ((vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> *)local_28)
  ;
  for (tmp.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
      tmp.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ <
      vsp.super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      tmp.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           tmp.super___shared_ptr<Thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ + 1) {
    this_00 = (Thread *)operator_new(200);
    std::function<void()>::function<void(&)(),void>((function<void()> *)&local_70,threadFunc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i_1,"testFunc",&local_91);
    Thread::Thread(this_00,&local_70,(string *)&i_1);
    std::shared_ptr<Thread>::shared_ptr<Thread,void>((shared_ptr<Thread> *)local_40,this_00);
    std::__cxx11::string::~string((string *)&i_1);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::function<void_()>::~function(&local_70);
    std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::push_back
              ((vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> *)
               local_28,(value_type *)local_40);
    std::shared_ptr<Thread>::~shared_ptr((shared_ptr<Thread> *)local_40);
  }
  for (local_98 = 0;
      local_98 <
      vsp.super__Vector_base<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_98 = local_98 + 1) {
    this_01 = (__shared_ptr_access<Thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::
              operator[]((vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>
                          *)local_28,(long)local_98);
    this_02 = std::__shared_ptr_access<Thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        (this_01);
    Thread::start(this_02);
  }
  sleep(3);
  std::vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_>::~vector
            ((vector<std::shared_ptr<Thread>,_std::allocator<std::shared_ptr<Thread>_>_> *)local_28)
  ;
  return;
}

Assistant:

void stressing_multi_threads(int threadNum = 4)
{
    // threadNum * 100000 lines
    cout << "----------stressing test multi thread-----------" << endl;
    vector<shared_ptr<Thread>> vsp;
    for (int i = 0; i < threadNum; ++i)
    {
        shared_ptr<Thread> tmp(new Thread(threadFunc, "testFunc"));
        vsp.push_back(tmp);
    }
    for (int i = 0; i < threadNum; ++i)
    {
        vsp[i]->start();
    }
    sleep(3);
}